

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv.cpp
# Opt level: O3

void free_key_material(key_material_t *pkey)

{
  void *__ptr;
  long lVar1;
  
  if (pkey != (key_material_t *)0x0) {
    lVar1 = 8;
    do {
      __ptr = *(void **)((long)&pkey->size + lVar1);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x128);
  }
  return;
}

Assistant:

void free_key_material(key_material_t* pkey)
{
	int i;

	if (!pkey)
	{
		return;
	}

	for (i = 0; i < TAG_MAX; i++)
	{
		if (pkey[i].big)
		{
			free(pkey[i].big);
		}
	}
}